

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O0

Expression *
slang::ast::matchElementValue
          (ASTContext *context,Type *elementType,FieldSymbol *targetField,SourceRange sourceRange,
          span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
          typeSetters,Expression *defaultSetter)

{
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  string_view arg;
  bitmask<slang::ast::ASTFlags> extraFlags;
  bitmask<slang::ast::ASTFlags> extraFlags_00;
  SourceRange assignmentRange;
  SourceRange assignmentRange_00;
  SourceRange sourceRange_02;
  SourceRange sourceRange_03;
  bool bVar1;
  int32_t iVar2;
  int32_t iVar3;
  int iVar4;
  Type *pTVar5;
  Expression *pEVar6;
  UnpackedStructType *pUVar7;
  PackedStructType *pPVar8;
  undefined4 extraout_var;
  ConstantRange this;
  Compilation *args_2;
  undefined4 extraout_var_00;
  SourceLocation in_RCX;
  Type *in_RDX;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  ASTContext *in_RSI;
  SourceLocation in_RDI;
  FieldSymbol *in_R9;
  span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
  in_stack_00000000;
  Diagnostic *in_stack_00000010;
  Diagnostic *diag;
  Compilation *comp_1;
  int32_t i;
  ConstantRange arrayRange;
  SmallVector<const_slang::ast::Expression_*,_5UL> elements_1;
  Expression *elemExpr_1;
  Type *nestedElemType;
  Compilation *comp;
  Expression *elemExpr;
  Type *type;
  FieldSymbol *field;
  specific_symbol_iterator<slang::ast::FieldSymbol> __end3;
  specific_symbol_iterator<slang::ast::FieldSymbol> __begin3;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_(std::ranges::subrange_kind)0>
  *__range3;
  SmallVector<const_slang::ast::Expression_*,_5UL> elements;
  Scope *structScope;
  ExpressionSyntax *defaultSyntax;
  TypeSetter *setter;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
  *__range2;
  Expression *found;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffc58;
  __extent_storage<18446744073709551615UL> this_00;
  Diagnostic *in_stack_fffffffffffffc60;
  Diagnostic *this_01;
  SourceLocation in_stack_fffffffffffffc68;
  Scope *in_stack_fffffffffffffc70;
  DiagCode noteCode;
  ASTContext *in_stack_fffffffffffffc78;
  SourceLocation in_stack_fffffffffffffc80;
  SourceLocation in_stack_fffffffffffffc88;
  undefined8 in_stack_fffffffffffffc90;
  DiagCode code;
  Diagnostic *in_stack_fffffffffffffca0;
  span<const_slang::ast::Expression_*,_18446744073709551615UL> *in_stack_fffffffffffffca8;
  undefined4 in_stack_fffffffffffffcb0;
  undefined4 in_stack_fffffffffffffcb4;
  int32_t iVar9;
  undefined4 in_stack_fffffffffffffcb8;
  undefined4 in_stack_fffffffffffffcbc;
  BumpAllocator *in_stack_fffffffffffffcc0;
  undefined7 in_stack_fffffffffffffd00;
  undefined1 in_stack_fffffffffffffd07;
  ExpressionSyntax *in_stack_fffffffffffffd08;
  Type *in_stack_fffffffffffffd10;
  undefined7 in_stack_fffffffffffffd18;
  undefined1 in_stack_fffffffffffffd1f;
  SourceLocation in_stack_fffffffffffffd20;
  SourceLocation in_stack_fffffffffffffd28;
  Scope *local_2c8;
  Scope *local_2b8;
  bitmask<slang::ast::ASTFlags> local_220 [3];
  SourceRange *local_208;
  undefined1 local_1f1;
  Compilation *local_1f0;
  int32_t local_1e4;
  ConstantRange local_1e0;
  SmallVectorBase<const_slang::ast::Expression_*> local_1d8 [2];
  size_t local_198;
  Expression *local_178;
  Type *local_170;
  undefined8 local_168;
  undefined1 local_151;
  Compilation *local_150;
  size_t local_148;
  Expression *local_120;
  undefined4 local_114;
  Type *local_110;
  FieldSymbol *local_108;
  Symbol *local_100;
  Symbol *local_f8;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_(std::ranges::subrange_kind)0>
  local_e0;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_(std::ranges::subrange_kind)0>
  *local_d0;
  SmallVectorBase<const_slang::ast::Expression_*> local_c8 [2];
  Scope *local_88;
  bitmask<slang::ast::ASTFlags> local_80 [3];
  SourceLocation local_68;
  reference local_60;
  TypeSetter *local_58;
  __normal_iterator<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter_*,_std::span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>_>
  local_50;
  undefined1 *local_48;
  SimpleAssignmentPatternExpression *local_8;
  
  bVar1 = Type::isError((Type *)0x9ec344);
  if (bVar1) {
    local_8 = (SimpleAssignmentPatternExpression *)0x0;
  }
  else {
    local_8 = (SimpleAssignmentPatternExpression *)0x0;
    local_48 = &stack0x00000008;
    local_50._M_current =
         (TypeSetter *)
         std::
         span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
         ::begin((span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
                  *)in_stack_fffffffffffffc58._M_extent_value);
    local_58 = (TypeSetter *)
               std::
               span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
               ::end((span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
                      *)in_stack_fffffffffffffc68);
    while( true ) {
      bVar1 = __gnu_cxx::
              operator==<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter_*,_std::span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>_>
                        ((__normal_iterator<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter_*,_std::span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>_>
                          *)in_stack_fffffffffffffc60,
                         (__normal_iterator<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter_*,_std::span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>_>
                          *)in_stack_fffffffffffffc58._M_extent_value);
      code = SUB84((ulong)in_stack_fffffffffffffc90 >> 0x20,0);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      local_60 = __gnu_cxx::
                 __normal_iterator<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter_*,_std::span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>_>
                 ::operator*(&local_50);
      pTVar5 = not_null::operator_cast_to_Type_((not_null<const_slang::ast::Type_*> *)0x9ec3e3);
      if (pTVar5 != (Type *)0x0) {
        not_null<const_slang::ast::Type_*>::operator*
                  ((not_null<const_slang::ast::Type_*> *)0x9ec406);
        bVar1 = Type::isMatching((Type *)CONCAT17(in_stack_fffffffffffffd1f,
                                                  in_stack_fffffffffffffd18),
                                 in_stack_fffffffffffffd10);
        if (bVar1) {
          local_8 = (SimpleAssignmentPatternExpression *)
                    not_null::operator_cast_to_Expression_
                              ((not_null<const_slang::ast::Expression_*> *)0x9ec42d);
        }
      }
      __gnu_cxx::
      __normal_iterator<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter_*,_std::span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>_>
      ::operator++(&local_50);
    }
    if (local_8 == (SimpleAssignmentPatternExpression *)0x0) {
      local_68 = (SourceLocation)0x0;
      if (in_R9 != (FieldSymbol *)0x0) {
        local_68 = (in_R9->super_VariableSymbol).super_ValueSymbol.super_Symbol.location;
        not_null<const_slang::ast::Type_*>::operator*
                  ((not_null<const_slang::ast::Type_*> *)0x9ec4c8);
        bVar1 = Type::isMatching((Type *)CONCAT17(in_stack_fffffffffffffd1f,
                                                  in_stack_fffffffffffffd18),
                                 in_stack_fffffffffffffd10);
        if (bVar1) {
          return (Expression *)in_R9;
        }
        bVar1 = Type::isSimpleBitVector((Type *)in_stack_fffffffffffffc68);
        if (bVar1) {
          not_null<const_slang::ast::Type_*>::operator*
                    ((not_null<const_slang::ast::Type_*> *)0x9ec52a);
          bVar1 = Type::isAssignmentCompatible
                            ((Type *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
                             (Type *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
          if (bVar1) {
            SourceRange::SourceRange((SourceRange *)in_stack_fffffffffffffc60);
            bitmask<slang::ast::ASTFlags>::bitmask(local_80,None);
            assignmentRange.endLoc = in_stack_fffffffffffffd28;
            assignmentRange.startLoc = in_stack_fffffffffffffd20;
            extraFlags.m_bits._7_1_ = in_stack_fffffffffffffd1f;
            extraFlags.m_bits._0_7_ = in_stack_fffffffffffffd18;
            pEVar6 = Expression::bindRValue
                               (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,assignmentRange,
                                (ASTContext *)
                                CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                                extraFlags);
            return pEVar6;
          }
        }
      }
      bVar1 = Type::isStruct((Type *)in_stack_fffffffffffffc58._M_extent_value);
      if (bVar1) {
        bVar1 = Type::isUnpackedStruct((Type *)0x9ec5f8);
        if (bVar1) {
          Type::getCanonicalType((Type *)in_stack_fffffffffffffc60);
          pUVar7 = Symbol::as<slang::ast::UnpackedStructType>((Symbol *)0x9ec613);
          local_2b8 = (Scope *)0x0;
          if (pUVar7 != (UnpackedStructType *)0x0) {
            local_2b8 = &pUVar7->super_Scope;
          }
          local_88 = local_2b8;
        }
        else {
          Type::getCanonicalType((Type *)in_stack_fffffffffffffc60);
          pPVar8 = Symbol::as<slang::ast::PackedStructType>((Symbol *)0x9ec669);
          local_2c8 = (Scope *)0x0;
          if (pPVar8 != (PackedStructType *)0x0) {
            local_2c8 = &pPVar8->super_Scope;
          }
          local_88 = local_2c8;
        }
        SmallVector<const_slang::ast::Expression_*,_5UL>::SmallVector
                  ((SmallVector<const_slang::ast::Expression_*,_5UL> *)0x9ec6b5);
        local_e0 = Scope::membersOfType<slang::ast::FieldSymbol>(in_stack_fffffffffffffc70);
        local_d0 = &local_e0;
        local_f8 = (Symbol *)
                   std::ranges::
                   subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_(std::ranges::subrange_kind)0>
                   ::begin(local_d0);
        local_100 = (Symbol *)
                    std::ranges::
                    subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_(std::ranges::subrange_kind)0>
                    ::end(local_d0);
        while( true ) {
          bVar1 = operator==<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>_>
                            ((self_type *)in_stack_fffffffffffffc60,
                             (specific_symbol_iterator<slang::ast::FieldSymbol> *)
                             in_stack_fffffffffffffc58._M_extent_value);
          if (((bVar1 ^ 0xffU) & 1) == 0) break;
          local_108 = iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_false>
                      ::operator*((iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_false>
                                   *)0x9ec76b);
          local_110 = ValueSymbol::getType((ValueSymbol *)0x9ec792);
          bVar1 = Type::isError((Type *)0x9ec7b9);
          if (bVar1) {
LAB_009ec7e6:
            local_8 = (SimpleAssignmentPatternExpression *)0x0;
            goto LAB_009ec9d8;
          }
          bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                            (&(local_108->super_VariableSymbol).super_ValueSymbol.super_Symbol.name)
          ;
          if (bVar1) goto LAB_009ec7e6;
          in_stack_fffffffffffffc58 = in_stack_00000000._M_extent._M_extent_value;
          sourceRange_02.endLoc = in_RCX;
          sourceRange_02.startLoc = in_RDI;
          in_stack_fffffffffffffc60 = in_stack_00000010;
          local_148 = in_stack_fffffffffffffc58._M_extent_value;
          local_120 = matchElementValue(in_RSI,in_RDX,in_R9,sourceRange_02,in_stack_00000000,
                                        (Expression *)local_8);
          if (local_120 == (Expression *)0x0) {
            local_8 = (SimpleAssignmentPatternExpression *)0x0;
            goto LAB_009ec9d8;
          }
          SmallVectorBase<const_slang::ast::Expression_*>::push_back
                    ((SmallVectorBase<const_slang::ast::Expression_*> *)in_stack_fffffffffffffc60,
                     (Expression **)in_stack_fffffffffffffc58._M_extent_value);
          iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_false>
          ::operator++<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>_>
                    ((iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_false>
                      *)in_stack_fffffffffffffc60);
        }
        local_150 = ASTContext::getCompilation((ASTContext *)0x9ec909);
        local_151 = 0;
        iVar4 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                          (local_c8,(EVP_PKEY_CTX *)local_150,src);
        local_168 = CONCAT44(extraout_var,iVar4);
        local_8 = BumpAllocator::
                  emplace<slang::ast::SimpleAssignmentPatternExpression,slang::ast::Type_const&,bool,std::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::SourceRange&>
                            (in_stack_fffffffffffffcc0,
                             (Type *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
                             (bool *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                             in_stack_fffffffffffffca8,(SourceRange *)in_stack_fffffffffffffca0);
LAB_009ec9d8:
        local_114 = 1;
        SmallVector<const_slang::ast::Expression_*,_5UL>::~SmallVector
                  ((SmallVector<const_slang::ast::Expression_*,_5UL> *)0x9ec9e5);
      }
      else {
        bVar1 = Type::isArray((Type *)in_stack_fffffffffffffc58._M_extent_value);
        noteCode = SUB84((ulong)in_stack_fffffffffffffc70 >> 0x20,0);
        if ((bVar1) && (bVar1 = Type::hasFixedRange((Type *)in_stack_fffffffffffffc60), bVar1)) {
          local_170 = Type::getArrayElementType((Type *)in_stack_fffffffffffffc68);
          this_00 = in_stack_00000000._M_extent._M_extent_value;
          sourceRange_03.endLoc = in_RCX;
          sourceRange_03.startLoc = in_RDI;
          local_198 = this_00._M_extent_value;
          local_178 = matchElementValue(in_RSI,in_RDX,in_R9,sourceRange_03,in_stack_00000000,
                                        (Expression *)local_8);
          if (local_178 == (Expression *)0x0) {
            local_8 = (SimpleAssignmentPatternExpression *)0x0;
          }
          else {
            SmallVector<const_slang::ast::Expression_*,_5UL>::SmallVector
                      ((SmallVector<const_slang::ast::Expression_*,_5UL> *)0x9ecae6);
            this = Type::getFixedRange((Type *)this_00._M_extent_value);
            local_1e0 = this;
            iVar2 = ConstantRange::lower((ConstantRange *)0x9ecb14);
            this_01 = in_stack_00000010;
            local_1e4 = iVar2;
            while (iVar9 = local_1e4, iVar3 = ConstantRange::upper((ConstantRange *)0x9ecb3d),
                  iVar9 <= iVar3) {
              SmallVectorBase<const_slang::ast::Expression_*>::push_back
                        ((SmallVectorBase<const_slang::ast::Expression_*> *)this_01,
                         (Expression **)this_00._M_extent_value);
              local_1e4 = local_1e4 + 1;
            }
            args_2 = ASTContext::getCompilation((ASTContext *)0x9ecbae);
            local_1f1 = 0;
            local_1f0 = args_2;
            iVar4 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                              (local_1d8,(EVP_PKEY_CTX *)args_2,src_00);
            local_208 = (SourceRange *)CONCAT44(extraout_var_00,iVar4);
            local_8 = BumpAllocator::
                      emplace<slang::ast::SimpleAssignmentPatternExpression,slang::ast::Type_const&,bool,std::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::SourceRange&>
                                ((BumpAllocator *)this,(Type *)CONCAT44(iVar2,iVar3),
                                 (bool *)CONCAT44(iVar9,in_stack_fffffffffffffcb0),
                                 (span<const_slang::ast::Expression_*,_18446744073709551615UL> *)
                                 args_2,local_208);
            local_114 = 1;
            SmallVector<const_slang::ast::Expression_*,_5UL>::~SmallVector
                      ((SmallVector<const_slang::ast::Expression_*,_5UL> *)0x9ecc72);
          }
        }
        else if (in_R9 == (FieldSymbol *)0x0) {
          if (in_RDX == (Type *)0x0) {
            sourceRange_01.endLoc = in_stack_fffffffffffffc88;
            sourceRange_01.startLoc = in_stack_fffffffffffffc80;
            ASTContext::addDiag(in_stack_fffffffffffffc78,code,sourceRange_01);
          }
          else {
            sourceRange_00.endLoc = in_stack_fffffffffffffc88;
            sourceRange_00.startLoc = in_stack_fffffffffffffc80;
            ASTContext::addDiag(in_stack_fffffffffffffc78,code,sourceRange_00);
            arg._M_str._0_4_ = in_stack_fffffffffffffcb0;
            arg._M_len = (size_t)in_stack_fffffffffffffca8;
            arg._M_str._4_4_ = in_stack_fffffffffffffcb4;
            Diagnostic::operator<<(in_stack_fffffffffffffca0,arg);
            Diagnostic::addNote(in_stack_fffffffffffffc60,noteCode,in_stack_fffffffffffffc68);
          }
          local_8 = (SimpleAssignmentPatternExpression *)0x0;
        }
        else {
          SourceRange::SourceRange((SourceRange *)in_stack_fffffffffffffc60);
          bitmask<slang::ast::ASTFlags>::bitmask(local_220,None);
          assignmentRange_00.endLoc = in_stack_fffffffffffffd28;
          assignmentRange_00.startLoc = in_stack_fffffffffffffd20;
          extraFlags_00.m_bits._7_1_ = in_stack_fffffffffffffd1f;
          extraFlags_00.m_bits._0_7_ = in_stack_fffffffffffffd18;
          local_8 = (SimpleAssignmentPatternExpression *)
                    Expression::bindRValue
                              (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,
                               assignmentRange_00,
                               (ASTContext *)
                               CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                               extraFlags_00);
        }
      }
    }
  }
  return (Expression *)local_8;
}

Assistant:

static const Expression* matchElementValue(
    const ASTContext& context, const Type& elementType, const FieldSymbol* targetField,
    SourceRange sourceRange,
    std::span<const StructuredAssignmentPatternExpression::TypeSetter> typeSetters,
    const Expression* defaultSetter) {

    // Every element in the array or structure must be covered by one of:
    // index:value      -- recorded in the indexMap (handled only at the top level, not here)
    // member:value     -- recorded in the memberMap (handled only at the top level, not here)
    // type:value       -- recorded in typeSetters, last one takes precedence
    // default:value    -- recorded in defaultSetter, types must be assignable
    // struct element   -- recursively descend into the struct
    // array element    -- recursively descend into the array

    if (elementType.isError())
        return nullptr;

    // Try all type setters for a match. Last one that matches wins.
    const Expression* found = nullptr;
    for (auto& setter : typeSetters) {
        if (setter.type && elementType.isMatching(*setter.type))
            found = setter.expr;
    }
    if (found)
        return found;

    // Otherwise, see if we have a default value that can be applied.
    // The default applies if:
    // - The element type matches exactly
    // - The element type is a simple bit vector and the type is assignment compatible
    const ExpressionSyntax* defaultSyntax = nullptr;
    if (defaultSetter) {
        defaultSyntax = defaultSetter->syntax;
        SLANG_ASSERT(defaultSyntax);
    }

    if (defaultSetter) {
        if (elementType.isMatching(*defaultSetter->type))
            return defaultSetter;

        if (elementType.isSimpleBitVector() &&
            elementType.isAssignmentCompatible(*defaultSetter->type)) {
            return &Expression::bindRValue(elementType, *defaultSyntax, {}, context);
        }
    }

    // Otherwise, we check first if the type is a struct or array, in which
    // case we descend recursively into its members before continuing on with the default.
    if (elementType.isStruct()) {
        const Scope* structScope;
        if (elementType.isUnpackedStruct())
            structScope = &elementType.getCanonicalType().as<UnpackedStructType>();
        else
            structScope = &elementType.getCanonicalType().as<PackedStructType>();

        SmallVector<const Expression*> elements;
        for (auto& field : structScope->membersOfType<FieldSymbol>()) {
            const Type& type = field.getType();
            if (type.isError() || field.name.empty())
                return nullptr;

            auto elemExpr = matchElementValue(context, type, &field, sourceRange, typeSetters,
                                              defaultSetter);
            if (!elemExpr)
                return nullptr;

            elements.push_back(elemExpr);
        }

        auto& comp = context.getCompilation();
        return comp.emplace<SimpleAssignmentPatternExpression>(elementType, /* isLValue */ false,
                                                               elements.copy(comp), sourceRange);
    }

    if (elementType.isArray() && elementType.hasFixedRange()) {
        auto nestedElemType = elementType.getArrayElementType();
        SLANG_ASSERT(nestedElemType);

        auto elemExpr = matchElementValue(context, *nestedElemType, nullptr, sourceRange,
                                          typeSetters, defaultSetter);
        if (!elemExpr)
            return nullptr;

        SmallVector<const Expression*> elements;
        auto arrayRange = elementType.getFixedRange();
        for (int32_t i = arrayRange.lower(); i <= arrayRange.upper(); i++)
            elements.push_back(elemExpr);

        auto& comp = context.getCompilation();
        return comp.emplace<SimpleAssignmentPatternExpression>(elementType, /* isLValue */ false,
                                                               elements.copy(comp), sourceRange);
    }

    // Finally, if we have a default then it must now be assignment compatible.
    if (defaultSetter)
        return &Expression::bindRValue(elementType, *defaultSyntax, {}, context);

    // Otherwise there's no setter for this element, which is an error.
    if (targetField) {
        auto& diag = context.addDiag(diag::AssignmentPatternNoMember, sourceRange);
        diag << targetField->name;
        diag.addNote(diag::NoteDeclarationHere, targetField->location);
    }
    else {
        context.addDiag(diag::AssignmentPatternMissingElements, sourceRange);
    }

    return nullptr;
}